

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexPlaneCollisionAlgorithm.cpp
# Opt level: O2

void __thiscall
cbtConvexPlaneCollisionAlgorithm::processCollision
          (cbtConvexPlaneCollisionAlgorithm *this,cbtCollisionObjectWrapper *body0Wrap,
          cbtCollisionObjectWrapper *body1Wrap,cbtDispatcherInfo *dispatchInfo,
          cbtManifoldResult *resultOut)

{
  cbtCollisionShape *pcVar1;
  cbtCollisionObjectWrapper *pcVar2;
  cbtCollisionShape *pcVar3;
  cbtCollisionShape *v;
  cbtDispatcherInfo *dispatchInfo_00;
  int i;
  int iVar4;
  cbtCollisionObjectWrapper *pcVar5;
  cbtScalar cVar6;
  float fVar7;
  undefined1 auVar9 [16];
  undefined1 auVar18 [56];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  cbtScalar acVar8 [4];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined8 uVar17;
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar19 [16];
  ulong uVar28;
  undefined1 auVar29 [56];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  cbtVector3 cVar30;
  cbtQuaternion cVar31;
  cbtScalar iterationAngle;
  cbtScalar distance;
  cbtQuaternion rotq;
  cbtVector3 normalOnSurfaceB;
  cbtVector3 v1;
  cbtQuaternion perturbeRot;
  cbtVector3 vtx;
  cbtTransform convexInPlaneTrans;
  cbtVector3 vtxInPlaneProjected;
  cbtTransform planeInConvex;
  float local_210;
  float local_20c;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  cbtCollisionShape *local_1e0;
  cbtCollisionShape *local_1d8;
  cbtCollisionObjectWrapper *local_1d0;
  cbtCollisionObjectWrapper *local_1c8;
  cbtQuaternion local_1c0;
  cbtScalar local_1ac;
  cbtVector3 local_1a8;
  undefined1 local_198 [16];
  cbtQuaternion local_188;
  cbtQuaternion local_178;
  cbtQuadWord local_168;
  cbtVector3 local_158;
  cbtQuaternion local_148;
  cbtTransform local_138;
  cbtTransform local_f8;
  cbtTransform local_b8;
  cbtMatrix3x3 local_78;
  cbtScalar acStack_48 [2];
  cbtScalar acStack_40 [4];
  
  if (this->m_manifoldPtr != (cbtPersistentManifold *)0x0) {
    pcVar5 = body0Wrap;
    pcVar2 = body1Wrap;
    if (this->m_isSwapped != false) {
      pcVar5 = body1Wrap;
      pcVar2 = body0Wrap;
    }
    pcVar1 = pcVar2->m_shape;
    local_1e0 = pcVar5->m_shape;
    dispatchInfo_00 = (cbtDispatcherInfo *)resultOut;
    local_1d8 = pcVar1 + 2;
    local_1d0 = body0Wrap;
    local_1c8 = body1Wrap;
    cbtTransform::inverse(&local_138,pcVar5->m_worldTransform);
    cbtTransform::operator*(&local_f8,&local_138,pcVar2->m_worldTransform);
    local_78.m_el[0].m_floats[0] = local_f8.m_basis.m_el[0].m_floats[0];
    local_78.m_el[0].m_floats[1] = local_f8.m_basis.m_el[0].m_floats[1];
    local_78.m_el[0].m_floats[2] = local_f8.m_basis.m_el[0].m_floats[2];
    local_78.m_el[0].m_floats[3] = local_f8.m_basis.m_el[0].m_floats[3];
    local_78.m_el[1].m_floats[0] = local_f8.m_basis.m_el[1].m_floats[0];
    local_78.m_el[1].m_floats[1] = local_f8.m_basis.m_el[1].m_floats[1];
    local_78.m_el[1].m_floats[2] = local_f8.m_basis.m_el[1].m_floats[2];
    local_78.m_el[1].m_floats[3] = local_f8.m_basis.m_el[1].m_floats[3];
    local_78.m_el[2].m_floats[0] = local_f8.m_basis.m_el[2].m_floats[0];
    local_78.m_el[2].m_floats[1] = local_f8.m_basis.m_el[2].m_floats[1];
    local_78.m_el[2].m_floats[2] = local_f8.m_basis.m_el[2].m_floats[2];
    local_78.m_el[2].m_floats[3] = local_f8.m_basis.m_el[2].m_floats[3];
    acStack_48[0] = local_f8.m_origin.m_floats[0];
    acStack_48[1] = local_f8.m_origin.m_floats[1];
    acStack_40[0] = local_f8.m_origin.m_floats[2];
    acStack_40[1] = local_f8.m_origin.m_floats[3];
    uVar28 = 0;
    cbtTransform::inverse(&local_b8,pcVar2->m_worldTransform);
    cbtTransform::operator*(&local_138,&local_b8,pcVar5->m_worldTransform);
    pcVar3 = local_1e0;
    local_f8.m_basis.m_el[0].m_floats[0] = local_138.m_basis.m_el[0].m_floats[0];
    local_f8.m_basis.m_el[0].m_floats[1] = local_138.m_basis.m_el[0].m_floats[1];
    local_f8.m_basis.m_el[0].m_floats[2] = local_138.m_basis.m_el[0].m_floats[2];
    local_f8.m_basis.m_el[0].m_floats[3] = local_138.m_basis.m_el[0].m_floats[3];
    local_f8.m_basis.m_el[1].m_floats[0] = local_138.m_basis.m_el[1].m_floats[0];
    local_f8.m_basis.m_el[1].m_floats[1] = local_138.m_basis.m_el[1].m_floats[1];
    local_f8.m_basis.m_el[1].m_floats[2] = local_138.m_basis.m_el[1].m_floats[2];
    local_f8.m_basis.m_el[1].m_floats[3] = local_138.m_basis.m_el[1].m_floats[3];
    local_f8.m_basis.m_el[2].m_floats[0] = local_138.m_basis.m_el[2].m_floats[0];
    local_f8.m_basis.m_el[2].m_floats[1] = local_138.m_basis.m_el[2].m_floats[1];
    local_f8.m_basis.m_el[2].m_floats[2] = local_138.m_basis.m_el[2].m_floats[2];
    local_f8.m_basis.m_el[2].m_floats[3] = local_138.m_basis.m_el[2].m_floats[3];
    local_f8.m_origin.m_floats[0] = local_138.m_origin.m_floats[0];
    local_f8.m_origin.m_floats[1] = local_138.m_origin.m_floats[1];
    local_f8.m_origin.m_floats[2] = local_138.m_origin.m_floats[2];
    local_f8.m_origin.m_floats[3] = local_138.m_origin.m_floats[3];
    auVar18 = ZEXT856((ulong)local_138.m_basis.m_el[0].m_floats._8_8_);
    auVar29 = ZEXT856(uVar28);
    cVar30 = ::operator-((cbtVector3 *)(pcVar1 + 2));
    auVar20._0_8_ = cVar30.m_floats._8_8_;
    auVar20._8_56_ = auVar29;
    auVar10._0_8_ = cVar30.m_floats._0_8_;
    auVar10._8_56_ = auVar18;
    local_1a8.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar10._0_16_,auVar20._0_16_);
    auVar18 = ZEXT856(local_1a8.m_floats._8_8_);
    cVar30 = ::operator*(&local_78,&local_1a8);
    auVar21._0_8_ = cVar30.m_floats._8_8_;
    auVar21._8_56_ = auVar29;
    auVar11._0_8_ = cVar30.m_floats._0_8_;
    auVar11._8_56_ = auVar18;
    acVar8 = (cbtScalar  [4])vmovlhps_avx(auVar11._0_16_,auVar21._0_16_);
    local_b8.m_basis.m_el[0].m_floats = acVar8;
    (*pcVar3->_vptr_cbtCollisionShape[0x10])(pcVar3,&local_b8);
    auVar29 = auVar21._8_56_;
    local_138.m_basis.m_el[0].m_floats = (cbtScalar  [4])vmovlhps_avx(acVar8,auVar21._0_16_);
    auVar18 = ZEXT856(local_138.m_basis.m_el[0].m_floats._8_8_);
    cVar30 = cbtTransform::operator()(&local_f8,(cbtVector3 *)&local_138);
    v = local_1d8;
    auVar22._0_8_ = cVar30.m_floats._8_8_;
    auVar22._8_56_ = auVar29;
    auVar12._0_8_ = cVar30.m_floats._0_8_;
    auVar12._8_56_ = auVar18;
    local_1f8 = auVar12._0_16_;
    auVar19 = vmovshdup_avx(local_1f8);
    local_208 = auVar22._0_16_;
    auVar19 = vfmadd231ss_fma(ZEXT416((uint)(auVar19._0_4_ *
                                            *(float *)((long)&pcVar1[2]._vptr_cbtCollisionShape + 4)
                                            )),local_1f8,
                              ZEXT416(*(uint *)&pcVar1[2]._vptr_cbtCollisionShape));
    auVar19 = vfmadd231ss_fma(auVar19,local_208,ZEXT416((uint)pcVar1[2].m_shapeType));
    local_20c = auVar19._0_4_ - *(float *)&pcVar1[2].m_userPointer;
    auVar18 = (undefined1  [56])0x0;
    cVar30 = ::operator*((cbtVector3 *)local_1d8,&local_20c);
    auVar23._0_8_ = cVar30.m_floats._8_8_;
    auVar23._8_56_ = auVar29;
    auVar13._0_8_ = cVar30.m_floats._0_8_;
    auVar13._8_56_ = auVar18;
    auVar19 = vsubps_avx(local_1f8,auVar13._0_16_);
    auVar9 = vsubps_avx(local_208,auVar23._0_16_);
    auVar29 = ZEXT856(auVar9._8_8_);
    local_b8.m_basis.m_el[0].m_floats = (cbtScalar  [4])vinsertps_avx(auVar19,auVar9,0x28);
    uVar17 = local_b8.m_basis.m_el[0].m_floats._8_8_;
    cVar30 = cbtTransform::operator()(pcVar2->m_worldTransform,(cbtVector3 *)&local_b8);
    auVar24._0_8_ = cVar30.m_floats._8_8_;
    auVar24._8_56_ = auVar29;
    local_208._8_8_ = uVar17;
    local_208._0_8_ = cVar30.m_floats._0_8_;
    local_198 = auVar24._0_16_;
    local_1f8._0_4_ = local_20c;
    cVar6 = cbtPersistentManifold::getContactBreakingThreshold(this->m_manifoldPtr);
    fVar7 = cVar6 + resultOut->m_closestPointDistanceThreshold;
    auVar18 = (undefined1  [56])0x0;
    resultOut->m_manifoldPtr = this->m_manifoldPtr;
    if ((float)local_1f8._0_4_ < fVar7) {
      cVar30 = ::operator*(&pcVar2->m_worldTransform->m_basis,(cbtVector3 *)v);
      auVar25._0_8_ = cVar30.m_floats._8_8_;
      auVar25._8_56_ = auVar29;
      auVar14._0_8_ = cVar30.m_floats._0_8_;
      auVar14._8_56_ = auVar18;
      local_1a8.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar14._0_16_,auVar25._0_16_);
      local_158.m_floats = (cbtScalar  [4])vunpcklpd_avx(local_208,local_198);
      fVar7 = local_20c;
      (*(resultOut->super_Result)._vptr_Result[4])(resultOut);
    }
    if ((pcVar3->m_shapeType < 7) &&
       (resultOut->m_manifoldPtr->m_cachedPoints < this->m_minimumPointsPerturbationThreshold)) {
      cbtPlaneSpace1<cbtVector3>((cbtVector3 *)v,&local_1a8,&local_158);
      (*pcVar3->_vptr_cbtCollisionShape[4])(pcVar3);
      auVar19 = vminss_avx(SUB6416(ZEXT464(0x3ec90fdb),0),
                           ZEXT416((uint)(gContactBreakingThreshold / fVar7)));
      local_1ac = auVar19._0_4_;
      cbtQuaternion::setRotation(&local_148,&local_1a8,&local_1ac);
      for (iVar4 = 0; iVar4 < this->m_numPerturbationIterations; iVar4 = iVar4 + 1) {
        local_210 = (6.2831855 / (float)this->m_numPerturbationIterations) * (float)iVar4;
        cbtQuaternion::setRotation(&local_1c0,(cbtVector3 *)v,&local_210);
        auVar19._0_4_ = -local_1c0.super_cbtQuadWord.m_floats[2];
        auVar19._4_4_ = 0x80000000;
        auVar19._8_4_ = 0x80000000;
        auVar19._12_4_ = 0x80000000;
        auVar19 = vinsertps_avx(auVar19,ZEXT416((uint)local_1c0.super_cbtQuadWord.m_floats[3]),0x1c)
        ;
        auVar29 = ZEXT856(auVar19._8_8_);
        auVar9._0_8_ = local_1c0.super_cbtQuadWord.m_floats._0_8_ ^ 0x8000000080000000;
        auVar9._8_4_ = 0x80000000;
        auVar9._12_4_ = 0x80000000;
        local_188.super_cbtQuadWord.m_floats = (cbtQuadWord)vmovlhps_avx(auVar9,auVar19);
        auVar18 = ZEXT856(local_188.super_cbtQuadWord.m_floats._8_8_);
        cVar31 = ::operator*(&local_188,&local_148);
        auVar26._0_8_ = cVar31.super_cbtQuadWord.m_floats._8_8_;
        auVar26._8_56_ = auVar29;
        auVar15._0_8_ = cVar31.super_cbtQuadWord.m_floats._0_8_;
        auVar15._8_56_ = auVar18;
        local_178.super_cbtQuadWord.m_floats =
             (cbtQuadWord)vmovlhps_avx(auVar15._0_16_,auVar26._0_16_);
        auVar18 = ZEXT856(local_178.super_cbtQuadWord.m_floats._8_8_);
        cVar31 = ::operator*(&local_178,&local_1c0);
        auVar27._0_8_ = cVar31.super_cbtQuadWord.m_floats._8_8_;
        auVar27._8_56_ = auVar29;
        auVar16._0_8_ = cVar31.super_cbtQuadWord.m_floats._0_8_;
        auVar16._8_56_ = auVar18;
        local_168.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar16._0_16_,auVar27._0_16_);
        collideSingleContact
                  (this,(cbtQuaternion *)&local_168,local_1d0,local_1c8,dispatchInfo_00,resultOut);
      }
    }
    if ((this->m_ownManifold == true) && (this->m_manifoldPtr->m_cachedPoints != 0)) {
      cbtManifoldResult::refreshContactPoints(resultOut);
    }
  }
  return;
}

Assistant:

void cbtConvexPlaneCollisionAlgorithm::processCollision(const cbtCollisionObjectWrapper* body0Wrap, const cbtCollisionObjectWrapper* body1Wrap, const cbtDispatcherInfo& dispatchInfo, cbtManifoldResult* resultOut)
{
	(void)dispatchInfo;
	if (!m_manifoldPtr)
		return;

	const cbtCollisionObjectWrapper* convexObjWrap = m_isSwapped ? body1Wrap : body0Wrap;
	const cbtCollisionObjectWrapper* planeObjWrap = m_isSwapped ? body0Wrap : body1Wrap;

	cbtConvexShape* convexShape = (cbtConvexShape*)convexObjWrap->getCollisionShape();
	cbtStaticPlaneShape* planeShape = (cbtStaticPlaneShape*)planeObjWrap->getCollisionShape();

	bool hasCollision = false;
	const cbtVector3& planeNormal = planeShape->getPlaneNormal();
	const cbtScalar& planeConstant = planeShape->getPlaneConstant();
	cbtTransform planeInConvex;
	planeInConvex = convexObjWrap->getWorldTransform().inverse() * planeObjWrap->getWorldTransform();
	cbtTransform convexInPlaneTrans;
	convexInPlaneTrans = planeObjWrap->getWorldTransform().inverse() * convexObjWrap->getWorldTransform();

	cbtVector3 vtx = convexShape->localGetSupportingVertex(planeInConvex.getBasis() * -planeNormal);
	cbtVector3 vtxInPlane = convexInPlaneTrans(vtx);
	cbtScalar distance = (planeNormal.dot(vtxInPlane) - planeConstant);

	cbtVector3 vtxInPlaneProjected = vtxInPlane - distance * planeNormal;
	cbtVector3 vtxInPlaneWorld = planeObjWrap->getWorldTransform() * vtxInPlaneProjected;

	hasCollision = distance < m_manifoldPtr->getContactBreakingThreshold()+ resultOut->m_closestPointDistanceThreshold;
	resultOut->setPersistentManifold(m_manifoldPtr);
	if (hasCollision)
	{
		/// report a contact. internally this will be kept persistent, and contact reduction is done
		cbtVector3 normalOnSurfaceB = planeObjWrap->getWorldTransform().getBasis() * planeNormal;
		cbtVector3 pOnB = vtxInPlaneWorld;
		resultOut->addContactPoint(normalOnSurfaceB, pOnB, distance);
	}

	//the perturbation algorithm doesn't work well with implicit surfaces such as spheres, cylinder and cones:
	//they keep on rolling forever because of the additional off-center contact points
	//so only enable the feature for polyhedral shapes (cbtBoxShape, cbtConvexHullShape etc)
	if (convexShape->isPolyhedral() && resultOut->getPersistentManifold()->getNumContacts() < m_minimumPointsPerturbationThreshold)
	{
		cbtVector3 v0, v1;
		cbtPlaneSpace1(planeNormal, v0, v1);
		//now perform 'm_numPerturbationIterations' collision queries with the perturbated collision objects

		const cbtScalar angleLimit = 0.125f * SIMD_PI;
		cbtScalar perturbeAngle;
		cbtScalar radius = convexShape->getAngularMotionDisc();
		perturbeAngle = gContactBreakingThreshold / radius;
		if (perturbeAngle > angleLimit)
			perturbeAngle = angleLimit;

		cbtQuaternion perturbeRot(v0, perturbeAngle);
		for (int i = 0; i < m_numPerturbationIterations; i++)
		{
			cbtScalar iterationAngle = i * (SIMD_2_PI / cbtScalar(m_numPerturbationIterations));
			cbtQuaternion rotq(planeNormal, iterationAngle);
			collideSingleContact(rotq.inverse() * perturbeRot * rotq, body0Wrap, body1Wrap, dispatchInfo, resultOut);
		}
	}

	if (m_ownManifold)
	{
		if (m_manifoldPtr->getNumContacts())
		{
			resultOut->refreshContactPoints();
		}
	}
}